

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O2

void av1_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  auVar4 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])round_ptr),0x54);
  auVar5 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])quant_ptr),0x54);
  auVar1 = *(undefined1 (*) [16])dequant_ptr;
  auVar6 = vpermq_avx2(ZEXT1632(auVar1),0x54);
  auVar12 = vpsraw_avx2(auVar6,1);
  auVar9 = vpcmpeqd_avx2(ZEXT1632(auVar1),ZEXT1632(auVar1));
  auVar3 = vpaddw_avx2(auVar12,auVar9);
  auVar2 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar9 = vpabsw_avx2(auVar2);
  auVar12 = vpcmpgtw_avx2(auVar12,auVar9);
  if (((uint)(SUB321(auVar12 >> 7,0) & 1) | (uint)(SUB321(auVar12 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar12 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar12 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar12 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar12 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar12 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar12 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar12 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar12 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar12 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar12 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar12 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar12 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar12 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar12 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar12 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar12 >> 0x8f,0) & 1) << 0x11
       | (uint)(SUB321(auVar12 >> 0x97,0) & 1) << 0x12 |
       (uint)(SUB321(auVar12 >> 0x9f,0) & 1) << 0x13 | (uint)(SUB321(auVar12 >> 0xa7,0) & 1) << 0x14
       | (uint)(SUB321(auVar12 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar12 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar12 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar12 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar12 >> 0xcf,0) & 1) << 0x19
       | (uint)(SUB321(auVar12 >> 0xd7,0) & 1) << 0x1a |
       (uint)(SUB321(auVar12 >> 0xdf,0) & 1) << 0x1b | (uint)(SUB321(auVar12 >> 0xe7,0) & 1) << 0x1c
       | (uint)(SUB321(auVar12 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar12 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar12[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar9 = auVar10._0_32_;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar9;
    *(undefined1 (*) [32])qcoeff_ptr = auVar9;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar9;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar9;
  }
  else {
    auVar9 = vpaddsw_avx2(auVar9,auVar4);
    auVar9 = vpmulhw_avx2(auVar9,auVar5);
    auVar12 = vpsignw_avx2(auVar9,auVar2);
    auVar2 = vpmullw_avx2(auVar12,auVar6);
    auVar13 = vpsraw_avx2(auVar12,0xf);
    auVar8 = vpunpcklwd_avx2(auVar12,auVar13);
    auVar12 = vpunpckhwd_avx2(auVar12,auVar13);
    *(undefined1 (*) [32])qcoeff_ptr = auVar8;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar12;
    auVar8 = vpsraw_avx2(auVar2,0xf);
    auVar12 = vpunpcklwd_avx2(auVar2,auVar8);
    auVar2 = vpunpckhwd_avx2(auVar2,auVar8);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar12;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar2;
    auVar2 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar9 = vpcmpgtw_avx2(auVar9,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar2 = vpsubw_avx2(auVar2,auVar9);
    auVar2 = vpmaxsw_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar9 = vpand_avx2(auVar9,auVar2);
    auVar10 = ZEXT3264(auVar9);
  }
  auVar9 = vpermq_avx2(auVar4,0xee);
  auVar2 = vpermq_avx2(auVar5,0xee);
  auVar12 = vpermq_avx2(auVar6,0xee);
  auVar3 = vpermq_avx2(auVar3,0xee);
  do {
    lVar7 = 0;
    while( true ) {
      iscan_ptr = (int16_t *)((long)iscan_ptr + 0x20);
      if (n_coeffs < 0x11) {
        auVar1 = vpmaxsw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar11._8_2_ = 0x7fff;
        auVar11._0_8_ = 0x7fff7fff7fff7fff;
        auVar11._10_2_ = 0x7fff;
        auVar11._12_2_ = 0x7fff;
        auVar11._14_2_ = 0x7fff;
        auVar1 = vpsubusw_avx(auVar11,auVar1);
        auVar1 = vphminposuw_avx(auVar1);
        *eob_ptr = auVar1._0_2_ ^ 0x7fff;
        return;
      }
      auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar7 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar7 + 0x60));
      auVar4 = vpabsw_avx2(auVar5);
      auVar6 = vpcmpgtw_avx2(auVar4,auVar3);
      auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar6 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar6 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar6 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar6 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar6 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar6 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar6 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar6 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar6 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar6 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar6 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar6 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar6 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar6 >> 0x7f,0) != '\0') ||
                        (auVar6 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar6 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar6 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar6 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar6 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar6 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar6 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar6 >> 0xbf,0) != '\0') ||
                (auVar6 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar6 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar6 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar6 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar6 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar6 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      break;
      ((undefined1 (*) [32])(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar7))[1] = auVar8;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar7) = auVar8;
      ((undefined1 (*) [32])(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar7))[1] = auVar8;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar7) = auVar8;
      lVar7 = lVar7 + 0x40;
      n_coeffs = n_coeffs + -0x10;
    }
    auVar4 = vpaddsw_avx2(auVar4,auVar9);
    auVar4 = vpmulhw_avx2(auVar4,auVar2);
    auVar6 = vpsignw_avx2(auVar4,auVar5);
    auVar5 = vpmullw_avx2(auVar6,auVar12);
    auVar4 = vpcmpgtw_avx2(auVar4,auVar8);
    auVar13 = vpsraw_avx2(auVar6,0xf);
    auVar8 = vpunpcklwd_avx2(auVar6,auVar13);
    auVar6 = vpunpckhwd_avx2(auVar6,auVar13);
    qcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar7);
    *(undefined1 (*) [32])qcoeff_ptr = auVar8;
    *(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) = auVar6;
    auVar8 = vpsraw_avx2(auVar5,0xf);
    auVar6 = vpunpcklwd_avx2(auVar5,auVar8);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar8);
    dqcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar7);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar6;
    *(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) = auVar5;
    auVar5 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar5 = vpsubw_avx2(auVar5,auVar4);
    auVar4 = vpand_avx2(auVar4,auVar5);
    auVar4 = vpmaxsw_avx2(auVar10._0_32_,auVar4);
    auVar10 = ZEXT3264(auVar4);
    n_coeffs = n_coeffs + -0x10;
    coeff_ptr = (tran_low_t *)((long)coeff_ptr + lVar7 + 0x40);
  } while( true );
}

Assistant:

void av1_quantize_fp_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *zbin_ptr, const int16_t *round_ptr,
                          const int16_t *quant_ptr,
                          const int16_t *quant_shift_ptr,
                          tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 0;
  const int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                   &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}